

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O3

void sysbvm_type_setTotalSlotCount
               (sysbvm_context_t *context,sysbvm_tuple_t type,size_t totalSlotCount)

{
  sysbvm_tuple_t sVar1;
  
  if (((type & 0xf) == 0 && type != 0) && ((*(byte *)(type + 8) & 0x80) == 0)) {
    if (totalSlotCount + 0x800000000000000 >> 0x3c == 0) {
      sVar1 = totalSlotCount << 4 | 0xb;
    }
    else {
      sVar1 = sysbvm_tuple_uint64_encodeBig(context,totalSlotCount);
    }
    *(sysbvm_tuple_t *)(type + 0x58) = sVar1;
  }
  return;
}

Assistant:

SYSBVM_API void sysbvm_type_setTotalSlotCount(sysbvm_context_t *context, sysbvm_tuple_t type, size_t totalSlotCount)
{
    if(!sysbvm_tuple_isNonNullPointer(type)) return;
    if(sysbvm_tuple_isDummyValue(type)) return;
    ((sysbvm_type_tuple_t*)type)->totalSlotCount = sysbvm_tuple_size_encode(context, totalSlotCount);
}